

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermission.cpp
# Opt level: O2

void __thiscall DIntermissionScreenCast::Drawer(DIntermissionScreenCast *this)

{
  byte bVar1;
  ushort uVar2;
  AActor *pAVar3;
  FFont *font;
  DFrameBuffer *this_00;
  spriteframe_t *psVar4;
  FPlayerSkin *pFVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  BYTE *string;
  FTexture *img;
  int iVar9;
  long lVar10;
  ulong uVar11;
  undefined8 in_stack_ffffffffffffffa0;
  undefined4 uVar12;
  undefined8 in_stack_ffffffffffffffa8;
  double local_48;
  double dStack_40;
  
  uVar12 = (undefined4)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
  uVar8 = (uint)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  DIntermissionScreen::Drawer(&this->super_DIntermissionScreen);
  string = (BYTE *)this->mName;
  if (string != (BYTE *)0x0) {
    if (*string == '$') {
      string = (BYTE *)FStringTable::operator()(&GStrings,(char *)(string + 1));
    }
    this_00 = screen;
    font = SmallFont;
    iVar9 = (screen->super_DSimpleCanvas).super_DCanvas.Width;
    iVar7 = FFont::StringWidth(SmallFont,string);
    DCanvas::DrawText((DCanvas *)this_00,font,0xb,(iVar9 - iVar7 * CleanXfac) / 2,
                      ((screen->super_DSimpleCanvas).super_DCanvas.Height * 0xb4) / 200,
                      (char *)string,0x40001393,CONCAT44(uVar12,1),(ulong)uVar8 << 0x20);
  }
  if (this->caststate != (FState *)0x0) {
    pAVar3 = this->mDefaults;
    local_48 = (pAVar3->Scale).X;
    dStack_40 = (pAVar3->Scale).Y;
    iVar9 = this->caststate->sprite;
    if ((((((pAVar3->flags4).Value & 0x20) == 0) && (pAVar3->SpawnState != (FState *)0x0)) &&
        (iVar9 == pAVar3->SpawnState->sprite)) &&
       ((bVar6 = PClass::IsAncestorOf
                           (APlayerPawn::RegistrationInfo.MyClass,&this->mClass->super_PClass),
        bVar6 && (skins != (FPlayerSkin *)0x0)))) {
      lVar10 = 0;
      uVar8 = PlayerClasses.Count;
      for (uVar11 = 0; pFVar5 = skins, uVar11 < uVar8; uVar11 = uVar11 + 1) {
        if (*(PClassActor **)((long)&(PlayerClasses.Array)->Type + lVar10) == this->mClass) {
          iVar7 = userinfo_t::GetSkin((userinfo_t *)(&DAT_017dbfb8 + (long)consoleplayer * 0x2a0));
          iVar9 = pFVar5[iVar7].sprite;
          uVar8 = PlayerClasses.Count;
          if (((this->mDefaults->flags4).Value & 0x20) == 0) {
            local_48 = pFVar5[iVar7].Scale.X;
            dStack_40 = pFVar5[iVar7].Scale.Y;
          }
        }
        lVar10 = lVar10 + 0x20;
      }
    }
    psVar4 = SpriteFrames.Array;
    uVar2 = sprites.Array[iVar9].spriteframes;
    bVar1 = this->caststate->Frame;
    img = FTextureManager::operator()
                    (&TexMan,(FTextureID)
                             SpriteFrames.Array[(ulong)bVar1 + (ulong)uVar2].Texture[0].texnum,false
                    );
    DCanvas::DrawTexture
              ((DCanvas *)screen,img,160.0,170.0,0x40001391,
               (dStack_40 * (double)img->Height) / (img->Scale).Y,
               ((double)img->Width * local_48) / (img->Scale).X,this->mDefaults->Alpha,1,0x40001395,
               (ulong)(psVar4[(ulong)bVar1 + (ulong)uVar2].Flip & 1),0x400013b0,0x400013af,
               0x400013a9,(ulong)(this->mDefaults->RenderStyle).AsDWORD,0x4000138c,0x4000138e,
               this->casttranslation,0);
  }
  return;
}

Assistant:

void DIntermissionScreenCast::Drawer ()
{
	spriteframe_t*		sprframe;
	FTexture*			pic;

	Super::Drawer();

	const char *name = mName;
	if (name != NULL)
	{
		if (*name == '$') name = GStrings(name+1);
		screen->DrawText (SmallFont, CR_UNTRANSLATED,
			(SCREENWIDTH - SmallFont->StringWidth (name) * CleanXfac)/2,
			(SCREENHEIGHT * 180) / 200,
			name,
			DTA_CleanNoMove, true, TAG_DONE);
	}

	// draw the current frame in the middle of the screen
	if (caststate != NULL)
	{
		DVector2 castscale = mDefaults->Scale;

		int castsprite = caststate->sprite;

		if (!(mDefaults->flags4 & MF4_NOSKIN) &&
			mDefaults->SpawnState != NULL && caststate->sprite == mDefaults->SpawnState->sprite &&
			mClass->IsDescendantOf(RUNTIME_CLASS(APlayerPawn)) &&
			skins != NULL)
		{
			// Only use the skin sprite if this class has not been removed from the
			// PlayerClasses list.
			for (unsigned i = 0; i < PlayerClasses.Size(); ++i)
			{
				if (PlayerClasses[i].Type == mClass)
				{
					FPlayerSkin *skin = &skins[players[consoleplayer].userinfo.GetSkin()];
					castsprite = skin->sprite;

					if (!(mDefaults->flags4 & MF4_NOSKIN))
					{
						castscale = skin->Scale;
					}

				}
			}
		}

		sprframe = &SpriteFrames[sprites[castsprite].spriteframes + caststate->GetFrame()];
		pic = TexMan(sprframe->Texture[0]);

		screen->DrawTexture (pic, 160, 170,
			DTA_320x200, true,
			DTA_FlipX, sprframe->Flip & 1,
			DTA_DestHeightF, pic->GetScaledHeightDouble() * castscale.Y,
			DTA_DestWidthF, pic->GetScaledWidthDouble() * castscale.X,
			DTA_RenderStyle, mDefaults->RenderStyle,
			DTA_AlphaF, mDefaults->Alpha,
			DTA_Translation, casttranslation,
			TAG_DONE);
	}
}